

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ground_plane.cpp
# Opt level: O1

void __thiscall polyscope::render::GroundPlane::draw(GroundPlane *this,bool isRedraw)

{
  element_type *peVar1;
  long *plVar2;
  element_type *peVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  undefined8 **ppuVar12;
  ulong uVar13;
  undefined4 *puVar14;
  byte bVar15;
  uint uVar16;
  float *pfVar17;
  char *__end;
  undefined8 uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined8 in_XMM0_Qa;
  float fVar53;
  float fVar54;
  undefined1 auVar52 [16];
  float fVar55;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar57 [12];
  undefined1 auVar59 [56];
  undefined1 extraout_var [56];
  undefined1 auVar56 [64];
  float fVar60;
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar73 [12];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 in_ZMM9 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_ZMM18 [64];
  vec4 vVar84;
  vec3 vVar85;
  type m;
  size_type __dnew;
  mat4 origViewMat;
  float local_35c;
  float local_358;
  float local_354;
  undefined8 local_350;
  undefined8 local_348;
  float afStack_340 [9];
  undefined8 local_31c;
  float afStack_314 [5];
  undefined8 local_300;
  double local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  uint local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  uint local_2cc;
  float local_2c8;
  float local_2c4;
  uint local_2c0;
  float local_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined1 local_1fc;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined1 local_1dc;
  undefined1 local_1d8 [16];
  undefined6 *local_1c8;
  undefined8 local_1c0;
  undefined6 local_1b8;
  undefined2 uStack_1b2;
  undefined6 uStack_1b0;
  undefined1 local_1aa;
  undefined6 **local_1a8;
  undefined6 *local_1a0;
  undefined6 *local_198 [2];
  undefined1 local_188 [16];
  undefined5 *local_178;
  undefined8 local_170;
  undefined5 local_168;
  undefined3 uStack_163;
  undefined5 uStack_160;
  undefined1 local_15b;
  undefined6 *local_158;
  undefined8 local_150;
  undefined6 local_148;
  undefined2 uStack_142;
  undefined6 uStack_140;
  undefined1 local_13a;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined5 *local_98;
  undefined8 local_90;
  undefined5 local_88;
  undefined3 uStack_83;
  undefined5 uStack_80;
  undefined1 local_7b;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  ulong uStack_40;
  undefined1 auVar58 [60];
  
  auVar73 = in_ZMM9._4_12_;
  auVar43 = in_ZMM18._0_16_;
  if ((options::groundPlaneMode != 0) && (view::style != 2)) {
    if (this->groundPlanePrepared == false) {
      prepare(this);
    }
    if (view::upDir != this->groundPlaneViewCached) {
      populateGroundPlaneGeometry(this);
    }
    pfVar11 = (float *)&state::boundingBox;
    switch(view::upDir) {
    case YUp:
    case NegYUp:
      pfVar11 = (float *)0x4bdd8c;
      uVar18 = 1;
      bVar15 = 1;
      bVar8 = false;
      break;
    case ZUp:
    case NegZUp:
      uVar18 = 2;
      bVar8 = true;
      bVar15 = 0;
      break;
    default:
      bVar8 = false;
      bVar15 = 0;
      uVar18 = 0;
    }
    local_350 = 0;
    local_35c = 0.0;
    local_2e8 = 0;
    local_354 = 0.0;
    local_2f0 = 0;
    local_358 = 0.0;
    iVar9 = (int)uVar18;
    if (iVar9 == 2) {
      pfVar17 = &local_35c;
    }
    else if (iVar9 == 1) {
      pfVar17 = (float *)((long)&local_350 + 4);
    }
    else {
      pfVar17 = (float *)&local_350;
    }
    fVar62 = *(float *)(&DAT_002ad8a0 + (ulong)(view::upDir - NegXUp < 3) * 4);
    *pfVar17 = 1.0;
    if (iVar9 == 1) {
      pfVar17 = &local_354;
    }
    else if (iVar9 == 0) {
      pfVar17 = (float *)((long)&local_2e8 + 4);
    }
    else {
      pfVar17 = (float *)&local_2e8;
    }
    *pfVar17 = fVar62;
    uVar16 = (iVar9 + 2U) % 3;
    if (uVar16 == 2) {
      pfVar17 = &local_358;
    }
    else if (uVar16 == 1) {
      pfVar17 = (float *)((long)&local_2f0 + 4);
    }
    else {
      pfVar17 = (float *)&local_2f0;
    }
    *pfVar17 = fVar62;
    pfVar17 = (float *)((long)&DAT_004bdd94 + (ulong)bVar15 * 4);
    if (bVar8) {
      pfVar11 = (float *)&DAT_004bdd90;
      pfVar17 = (float *)&DAT_004bdd9c;
    }
    if (fVar62 != 1.0) {
      pfVar17 = pfVar11;
    }
    if (NAN(fVar62)) {
      pfVar17 = pfVar11;
    }
    auVar41._0_8_ = (double)*pfVar17;
    auVar41._8_8_ = in_XMM0_Qa;
    local_1d8 = ZEXT416((uint)fVar62);
    auVar44._0_8_ = (double)fVar62;
    auVar44._8_8_ = 0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         state::lengthScale * 0.0001 +
         (double)(float)((uint)(options::groundPlaneHeightFactor & 1) *
                         (int)(float)(state::lengthScale * (double)DAT_004bdca4) +
                        (uint)!(bool)(options::groundPlaneHeightFactor & 1) * (int)DAT_004bdca4);
    auVar41 = vfnmadd213sd_fma(auVar42,auVar44,auVar41);
    auVar59 = ZEXT856(auVar41._8_8_);
    local_2f8 = auVar41._0_8_;
    vVar84 = Engine::getCurrentViewport(engine);
    auVar46._0_8_ = vVar84._8_8_;
    auVar46._8_56_ = auVar59;
    auVar41 = auVar46._0_16_;
    local_188 = auVar41;
    iVar9 = Engine::getSSAAFactor(engine);
    auVar57 = auVar41._4_12_;
    local_300 = uVar18;
    if ((!isRedraw) && (options::groundPlaneMode == 2)) {
      lVar19 = 0;
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[0xb])
                (peVar1,(ulong)(uint)((view::bufferWidth * iVar9) / 2),
                 (ulong)(uint)((view::bufferHeight * iVar9) / 2));
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[10])
                (peVar1,0,0,(ulong)(uint)((view::bufferWidth * iVar9) / 2),
                 (ulong)(uint)((view::bufferHeight * iVar9) / 2));
      Engine::setCurrentPixelScaling(engine,(float)iVar9 * 0.5);
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar7 = DAT_004bcaf8;
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      uVar6 = view::bgColor._4_4_;
      (peVar1->clearColor).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)view::bgColor
      ;
      (peVar1->clearColor).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar6;
      (peVar1->clearColor).field_2 = aVar7;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      local_78 = _viewMat;
      uStack_70 = view::viewMat_8;
      uStack_68 = DAT_004c06e0;
      uStack_60 = _DAT_004c06e8;
      uStack_58 = DAT_004c06f0;
      uStack_50 = _DAT_004c06f8;
      uStack_48 = DAT_004c0700;
      uStack_40 = DAT_004c0708;
      auVar35._0_4_ = (float)local_1d8._0_4_ * (float)local_350;
      auVar35._4_4_ = (float)local_1d8._0_4_ * (float)((ulong)local_350 >> 0x20);
      auVar35._8_4_ = (float)local_1d8._0_4_ * 0.0;
      auVar35._12_4_ = (float)local_1d8._0_4_ * 0.0;
      auVar41 = vmovshdup_avx(auVar35);
      fVar62 = (float)local_1d8._0_4_ * local_35c;
      pfVar11 = afStack_340;
      do {
        fVar60 = fVar62;
        if (((int)lVar19 != 2) && (fVar60 = auVar35._0_4_, (int)lVar19 == 1)) {
          fVar60 = auVar41._0_4_;
        }
        auVar20._0_4_ = auVar35._0_4_ * fVar60;
        auVar20._4_4_ = auVar35._4_4_ * fVar60;
        auVar20._8_4_ = auVar35._8_4_ * fVar60;
        auVar20._12_4_ = auVar35._12_4_ * fVar60;
        uVar18 = vmovlps_avx(auVar20);
        *(undefined8 *)(pfVar11 + -2) = uVar18;
        *pfVar11 = fVar62 * fVar60;
        uVar18 = local_300;
        lVar19 = lVar19 + 1;
        pfVar11 = pfVar11 + 3;
      } while (lVar19 != 3);
      auVar23._0_4_ = (float)local_348 + (float)local_348;
      auVar23._4_4_ = local_348._4_4_ + local_348._4_4_;
      auVar23._8_8_ = 0;
      auVar22._4_4_ = afStack_340[1];
      auVar22._0_4_ = afStack_340[0];
      auVar22._8_4_ = afStack_340[2];
      auVar22._12_4_ = afStack_340[3];
      auVar26._0_4_ = afStack_340[1] + afStack_340[1];
      auVar26._4_4_ = afStack_340[2] + afStack_340[2];
      auVar26._8_8_ = 0;
      auVar41 = vinsertps_avx(auVar22,ZEXT416((uint)afStack_340[3]),0x10);
      auVar25._0_4_ = auVar41._0_4_ + auVar41._0_4_;
      auVar25._4_4_ = auVar41._4_4_ + auVar41._4_4_;
      auVar25._8_4_ = auVar41._8_4_ + auVar41._8_4_;
      auVar25._12_4_ = auVar41._12_4_ + auVar41._12_4_;
      auVar27._0_4_ = (float)afStack_340._16_8_ + (float)afStack_340._16_8_;
      auVar27._4_4_ = SUB84(afStack_340._16_8_,4) + SUB84(afStack_340._16_8_,4);
      auVar27._8_8_ = 0;
      fVar62 = afStack_340[6] + afStack_340[6];
      auVar41 = vsubps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23);
      auVar42 = vsubps_avx(ZEXT816(0x3f80000000000000),auVar26);
      auVar44 = vsubps_avx(ZEXT816(0) << 0x20,auVar25);
      auVar35 = vsubps_avx(ZEXT816(0) << 0x20,auVar27);
      local_348._0_4_ = 0.0;
      local_1f8 = (undefined8 *)((ulong)local_1f8 & 0xffffffff00000000);
      local_218 = (undefined8 *)((ulong)local_218 & 0xffffffff00000000);
      auVar24._0_4_ = (float)local_2f8;
      auVar24._4_12_ = auVar73;
      auVar21._8_4_ = 0x80000000;
      auVar21._0_8_ = 0x8000000080000000;
      auVar21._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar24,auVar21);
      if ((int)local_300 == 2) {
        ppuVar12 = &local_218;
      }
      else if ((int)local_300 == 1) {
        ppuVar12 = &local_1f8;
      }
      else {
        ppuVar12 = (undefined8 **)&local_348;
      }
      *(int *)ppuVar12 = auVar20._0_4_;
      auVar24 = SUB6416(ZEXT464(0x80000000),0);
      auVar20 = vmulss_avx512f(ZEXT416((uint)(float)local_348),auVar24);
      auVar21 = vmulss_avx512f(ZEXT416((uint)local_1f8),auVar24);
      auVar22 = vsubss_avx512f(auVar21,ZEXT416((uint)(float)local_348));
      auVar23 = vsubss_avx512f(auVar20,ZEXT416((uint)local_1f8));
      fVar60 = auVar20._0_4_ + auVar21._0_4_;
      auVar20 = vmulss_avx512f(ZEXT416((uint)local_218),auVar24);
      fVar49 = auVar20._0_4_;
      auVar20 = vsubss_avx512f(ZEXT416((uint)fVar60),ZEXT416((uint)local_218));
      auVar70 = ZEXT816(0) << 0x40;
      fVar68 = auVar22._0_4_ + fVar49 + 0.0;
      local_2bc = auVar23._0_4_ + fVar49 + 0.0;
      auVar22 = vaddss_avx512f(auVar20,auVar70);
      local_2c0 = auVar22._0_4_;
      auVar23 = vaddss_avx512f(ZEXT416((uint)(fVar60 + fVar49)),SUB6416(ZEXT464(0x3f800000),0));
      local_2cc = auVar23._0_4_;
      auVar24 = vxorps_avx512vl(auVar43,auVar43);
      auVar25 = vmulps_avx512vl(auVar41,auVar24);
      auVar20 = vmovshdup_avx(auVar25);
      auVar43 = vhaddps_avx(auVar25,auVar25);
      auVar26 = vmulps_avx512vl(auVar44,auVar24);
      auVar20 = vaddss_avx512f(ZEXT416((uint)(auVar41._0_4_ + auVar20._0_4_)),auVar26);
      auVar27 = vaddss_avx512f(auVar43,auVar26);
      fVar49 = fVar68 * 0.0;
      auVar28 = vmulss_avx512f(ZEXT416((uint)local_2bc),auVar70);
      local_2c4 = fVar49 + auVar20._0_4_;
      auVar29 = vmulps_avx512vl(auVar42,auVar24);
      auVar21 = vmovshdup_avx512vl(auVar29);
      auVar20 = vhaddps_avx(auVar29,auVar29);
      auVar21 = vaddss_avx512f(auVar42,auVar21);
      auVar30 = vmovshdup_avx512vl(auVar26);
      auVar31 = vaddss_avx512f(auVar21,auVar30);
      auVar21 = vmovshdup_avx(auVar44);
      auVar21 = vaddss_avx512f(auVar21,auVar20);
      auVar20 = vaddss_avx512f(auVar20,auVar30);
      auVar76 = ZEXT416((uint)fVar49);
      auVar30 = vaddss_avx512f(auVar31,auVar76);
      auVar31 = vmulps_avx512vl(auVar35,auVar24);
      auVar32 = vmovshdup_avx512vl(auVar31);
      auVar33 = vaddss_avx512f(auVar35,auVar32);
      auVar35 = vmovshdup_avx(auVar35);
      auVar32 = vaddss_avx512f(auVar31,auVar32);
      auVar36 = ZEXT416((uint)(1.0 - fVar62));
      auVar34 = vmulss_avx512f(auVar36,auVar70);
      auVar33 = vaddss_avx512f(auVar33,auVar34);
      auVar35 = vaddss_avx512f(ZEXT416((uint)(auVar35._0_4_ + auVar31._0_4_)),auVar34);
      auVar31 = vaddss_avx512f(auVar36,auVar32);
      auVar32 = vaddss_avx512f(auVar32,auVar34);
      auVar33 = vaddss_avx512f(auVar33,auVar76);
      auVar35 = vaddss_avx512f(auVar35,auVar28);
      local_2c8 = auVar35._0_4_;
      auVar34 = vmulss_avx512f(ZEXT416((uint)(float)local_348),auVar70);
      auVar36 = vmulss_avx512f(ZEXT416((uint)local_1f8),auVar70);
      auVar37 = vaddss_avx512f(ZEXT416((uint)(float)local_348),auVar36);
      auVar38 = vaddss_avx512f(auVar34,ZEXT416((uint)local_1f8));
      auVar34 = vaddss_avx512f(auVar34,auVar36);
      auVar36 = vmulss_avx512f(ZEXT416((uint)local_218),auVar70);
      auVar37 = vaddss_avx512f(auVar37,auVar36);
      auVar38 = vaddss_avx512f(auVar38,auVar36);
      local_2d4 = auVar38._0_4_;
      auVar38 = vaddss_avx512f(ZEXT416((uint)local_218),auVar34);
      local_2d8 = auVar38._0_4_;
      auVar34 = vaddss_avx512f(auVar34,auVar36);
      auVar34 = vaddss_avx512f(auVar34,SUB6416(ZEXT464(0x3f800000),0));
      local_2d0 = auVar30._0_4_;
      auVar36 = vmulss_avx512f(auVar30,auVar70);
      auVar38 = vaddss_avx512f(ZEXT416((uint)local_2c4),auVar36);
      auVar39 = vmulss_avx512f(auVar33,auVar70);
      auVar40 = vmulss_avx512f(auVar35,auVar70);
      auVar35 = vaddss_avx512f(auVar39,auVar38);
      local_2dc = auVar35._0_4_;
      auVar35 = vinsertps_avx(auVar25,auVar29,0x1c);
      auVar41 = vinsertps_avx(auVar42,auVar41,0x4c);
      auVar29._0_4_ = auVar35._0_4_ + auVar41._0_4_;
      auVar29._4_4_ = auVar35._4_4_ + auVar41._4_4_;
      auVar29._8_4_ = auVar35._8_4_ + auVar41._8_4_;
      auVar29._12_4_ = auVar35._12_4_ + auVar41._12_4_;
      auVar41 = vaddps_avx512vl(auVar29,auVar26);
      auVar42 = vbroadcastss_avx512vl(auVar28);
      auVar74._0_4_ = auVar41._0_4_ + auVar42._0_4_;
      auVar74._4_4_ = auVar41._4_4_ + auVar42._4_4_;
      auVar74._8_4_ = auVar41._8_4_ + auVar42._8_4_;
      auVar74._12_4_ = auVar41._12_4_ + auVar42._12_4_;
      auVar42 = vmulps_avx512vl(auVar74,auVar24);
      auVar41 = vmovshdup_avx(auVar42);
      auVar35 = vaddss_avx512f(auVar40,ZEXT416((uint)(auVar74._0_4_ + auVar41._0_4_)));
      local_2e0 = auVar35._0_4_;
      auVar35 = vaddss_avx512f(auVar30,ZEXT416((uint)(local_2c4 * 0.0)));
      auVar24 = vmovshdup_avx512vl(auVar74);
      auVar35 = vaddss_avx512f(auVar39,auVar35);
      auVar25 = vaddss_avx512f(auVar24,auVar42);
      auVar25 = vaddss_avx512f(auVar40,auVar25);
      auVar22 = vmulss_avx512f(auVar22,auVar70);
      auVar43 = vaddss_avx512f(ZEXT416((uint)(auVar44._0_4_ + auVar43._0_4_)),auVar22);
      auVar44 = vaddss_avx512f(auVar21,auVar22);
      auVar21 = vaddss_avx512f(auVar31,auVar22);
      auVar26 = vmulss_avx512f(auVar44,auVar70);
      auVar29 = vaddss_avx512f(auVar43,auVar26);
      auVar30 = vmulss_avx512f(auVar21,auVar70);
      auVar29 = vaddss_avx512f(auVar30,auVar29);
      auVar38 = ZEXT416((uint)(auVar43._0_4_ * 0.0));
      auVar31 = vaddss_avx512f(auVar44,auVar38);
      auVar30 = vaddss_avx512f(auVar30,auVar31);
      auVar23 = vmulss_avx512f(auVar23,auVar70);
      auVar27 = vaddss_avx512f(auVar23,ZEXT416(auVar27._0_4_));
      auVar20 = vaddss_avx512f(auVar20,auVar23);
      auVar31 = vaddss_avx512f(auVar23,ZEXT416(auVar32._0_4_));
      auVar32 = vaddss_avx512f(auVar37,auVar70);
      fVar62 = local_2d4 + 0.0;
      fVar60 = local_2d8 + 0.0;
      fVar4 = auVar20._0_4_ * 0.0;
      fVar78 = auVar31._0_4_;
      fVar5 = auVar27._0_4_ * 0.0;
      auVar31 = vaddss_avx512f(auVar20,ZEXT416((uint)fVar5));
      auVar31 = vaddss_avx512f(ZEXT416((uint)(fVar78 * 0.0)),auVar31);
      auVar36 = vaddss_avx512f(ZEXT416((uint)(local_2c4 * 0.0)),auVar36);
      auVar26 = vaddss_avx512f(auVar38,auVar26);
      fVar49 = fVar49 + local_2dc;
      local_2b8 = ZEXT416((uint)fVar49);
      auVar35 = vaddss_avx512f(auVar76,auVar35);
      auVar36 = vaddss_avx512f(auVar33,auVar36);
      auVar36 = vaddss_avx512f(auVar76,auVar36);
      auVar37 = vaddss_avx512f(auVar28,ZEXT416(local_2e0));
      auVar25 = vaddss_avx512f(auVar28,auVar25);
      auVar41 = vaddss_avx512f(auVar28,ZEXT416((uint)(local_2c8 + auVar41._0_4_ + auVar42._0_4_)));
      auVar42 = vaddss_avx512f(auVar22,auVar29);
      auVar28 = vaddss_avx512f(auVar22,auVar30);
      auVar26 = vaddss_avx512f(auVar21,auVar26);
      auVar22 = vaddss_avx512f(auVar22,auVar26);
      auVar26 = vaddss_avx512f(auVar23,ZEXT416((uint)(fVar78 * 0.0 + auVar27._0_4_ + fVar4)));
      local_2a8 = vaddss_avx512f(auVar23,auVar31);
      auVar23 = vaddss_avx512f(auVar23,ZEXT416((uint)(fVar78 + fVar5 + fVar4)));
      auVar29 = vmulss_avx512f(auVar32,ZEXT416((uint)local_2c4));
      auVar30 = vmulss_avx512f(auVar32,auVar74);
      auVar43 = vmulss_avx512f(auVar32,auVar43);
      auVar27 = vmulss_avx512f(auVar32,auVar27);
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar62),auVar24);
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar62),auVar44);
      auVar31 = vmulss_avx512f(ZEXT416((uint)fVar60),auVar33);
      auVar21 = vmulss_avx512f(ZEXT416((uint)fVar60),auVar21);
      auVar32 = vmulss_avx512f(auVar34,ZEXT416((uint)fVar68));
      auVar33 = vmulss_avx512f(auVar34,ZEXT416((uint)local_2bc));
      auVar38 = vmulss_avx512f(auVar34,ZEXT416(local_2c0));
      auVar34 = vmulss_avx512f(auVar34,ZEXT416(local_2cc));
      auVar29 = vaddss_avx512f(auVar32,ZEXT416((uint)(auVar31._0_4_ +
                                                     auVar29._0_4_ + fVar62 * local_2d0)));
      auVar24 = vaddss_avx512f(auVar33,ZEXT416((uint)(local_2c8 * fVar60 +
                                                     auVar30._0_4_ + auVar24._0_4_)));
      fVar68 = auVar38._0_4_ + auVar21._0_4_ + auVar43._0_4_ + auVar44._0_4_;
      fVar62 = auVar34._0_4_ + fVar78 * fVar60 + auVar27._0_4_ + auVar20._0_4_ * fVar62;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = DAT_004c06e0;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = _DAT_004c06e8;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = DAT_004c06f0;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = DAT_004c0700;
      auVar43 = vbroadcastss_avx512vl(auVar36);
      fVar54 = view::viewMat;
      fVar66 = view::viewMat._4_4_;
      auVar41 = vbroadcastss_avx512vl(auVar41);
      fVar69 = view::viewMat._16_4_;
      fVar72 = view::viewMat._20_4_;
      auVar44 = vbroadcastss_avx512vl(auVar22);
      fVar60 = view::viewMat._32_4_;
      fVar5 = view::viewMat._36_4_;
      auVar36._0_4_ = auVar44._0_4_ * fVar60 + fVar69 * auVar41._0_4_ + fVar54 * auVar43._0_4_;
      auVar36._4_4_ = auVar44._4_4_ * fVar5 + fVar72 * auVar41._4_4_ + fVar66 * auVar43._4_4_;
      auVar36._8_4_ = auVar44._8_4_ * 0.0 + auVar41._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
      auVar36._12_4_ = auVar44._12_4_ * 0.0 + auVar41._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
      auVar20 = vbroadcastss_avx512vl(auVar23);
      auVar21 = vmulps_avx512vl(auVar31,auVar20);
      auVar21 = vaddps_avx512vl(auVar21,auVar36);
      fVar50 = view::viewMat._8_4_;
      fVar53 = view::viewMat._12_4_;
      fVar55 = view::viewMat._24_4_;
      fVar51 = view::viewMat._28_4_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = _DAT_004c06f8;
      auVar44 = vmulps_avx512vl(auVar83,auVar44);
      fVar4 = view::viewMat._56_4_;
      fVar78 = view::viewMat._60_4_;
      auVar33._0_4_ =
           auVar20._0_4_ * fVar4 + auVar44._0_4_ + fVar50 * auVar43._0_4_ + fVar55 * auVar41._0_4_;
      auVar33._4_4_ =
           auVar20._4_4_ * fVar78 + auVar44._4_4_ + fVar53 * auVar43._4_4_ + fVar51 * auVar41._4_4_;
      auVar33._8_4_ =
           auVar20._8_4_ * 0.0 + auVar44._8_4_ + auVar43._8_4_ * 0.0 + auVar41._8_4_ * 0.0;
      auVar33._12_4_ =
           auVar20._12_4_ * 0.0 + auVar44._12_4_ + auVar43._12_4_ * 0.0 + auVar41._12_4_ * 0.0;
      auVar43 = vbroadcastss_avx512vl(auVar29);
      auVar40._0_4_ = fVar54 * auVar43._0_4_;
      auVar40._4_4_ = fVar66 * auVar43._4_4_;
      auVar40._8_4_ = auVar43._8_4_ * 0.0;
      auVar40._12_4_ = auVar43._12_4_ * 0.0;
      auVar41 = vbroadcastss_avx512vl(auVar24);
      auVar44 = vmulps_avx512vl(auVar70,auVar41);
      auVar44 = vaddps_avx512vl(auVar40,auVar44);
      auVar81._4_4_ = fVar68;
      auVar81._0_4_ = fVar68;
      auVar81._8_4_ = fVar68;
      auVar81._12_4_ = fVar68;
      auVar20 = vmulps_avx512vl(auVar32,auVar81);
      auVar44 = vaddps_avx512vl(auVar20,auVar44);
      auVar76._4_4_ = fVar62;
      auVar76._0_4_ = fVar62;
      auVar76._8_4_ = fVar62;
      auVar76._12_4_ = fVar62;
      auVar20 = vmulps_avx512vl(auVar31,auVar76);
      auVar44 = vaddps_avx512vl(auVar20,auVar44);
      auVar38._0_4_ = auVar43._0_4_ * fVar50;
      auVar38._4_4_ = auVar43._4_4_ * fVar53;
      auVar38._8_4_ = auVar43._8_4_ * 0.0;
      auVar38._12_4_ = auVar43._12_4_ * 0.0;
      auVar43 = vmulps_avx512vl(auVar30,auVar41);
      auVar43 = vaddps_avx512vl(auVar38,auVar43);
      auVar41 = vmulps_avx512vl(auVar83,auVar81);
      auVar39._0_4_ = fVar62 * fVar4 + auVar41._0_4_ + auVar43._0_4_;
      auVar39._4_4_ = fVar62 * fVar78 + auVar41._4_4_ + auVar43._4_4_;
      auVar39._8_4_ = fVar62 * 0.0 + auVar41._8_4_ + auVar43._8_4_;
      auVar39._12_4_ = fVar62 * 0.0 + auVar41._12_4_ + auVar43._12_4_;
      auVar46 = vinsertf32x4_avx512f(ZEXT1664(auVar44),auVar39,1);
      auVar47 = vinsertf32x4_avx512f(ZEXT1664(auVar21),auVar33,1);
      auVar48 = vbroadcasti64x4_avx512f(_DAT_0029ef40);
      auVar46 = vpermi2pd_avx512f(auVar48,auVar47,auVar46);
      fVar62 = auVar37._0_4_;
      fVar67 = auVar42._0_4_;
      auVar43._4_4_ = fVar67;
      auVar43._0_4_ = fVar67;
      auVar43._8_4_ = fVar67;
      auVar43._12_4_ = fVar67;
      fVar68 = auVar26._0_4_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = _DAT_004c06f8;
      auVar43 = vmulps_avx512vl(auVar37,auVar43);
      auVar34._0_4_ = fVar68 * fVar4 + auVar43._0_4_ + fVar49 * fVar50 + fVar55 * fVar62;
      auVar34._4_4_ = fVar68 * fVar78 + auVar43._4_4_ + fVar49 * fVar53 + fVar51 * fVar62;
      auVar34._8_4_ = fVar68 * 0.0 + auVar43._8_4_ + fVar49 * 0.0 + fVar62 * 0.0;
      auVar34._12_4_ = fVar68 * 0.0 + auVar43._12_4_ + fVar49 * 0.0 + fVar62 * 0.0;
      auVar43 = vbroadcastss_avx512vl(auVar35);
      auVar41 = vbroadcastss_avx512vl(auVar25);
      auVar42 = vbroadcastss_avx512vl(auVar28);
      auVar44 = vmulps_avx512vl(auVar37,auVar42);
      auVar28._0_4_ =
           (float)local_2a8._0_4_ * fVar4 +
           auVar44._0_4_ + auVar43._0_4_ * fVar50 + auVar41._0_4_ * fVar55;
      auVar28._4_4_ =
           (float)local_2a8._0_4_ * fVar78 +
           auVar44._4_4_ + auVar43._4_4_ * fVar53 + auVar41._4_4_ * fVar51;
      auVar28._8_4_ =
           (float)local_2a8._0_4_ * 0.0 + auVar44._8_4_ + auVar43._8_4_ * 0.0 + auVar41._8_4_ * 0.0;
      auVar28._12_4_ =
           (float)local_2a8._0_4_ * 0.0 +
           auVar44._12_4_ + auVar43._12_4_ * 0.0 + auVar41._12_4_ * 0.0;
      auVar47 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412((float)local_2a8._0_4_ * 0.0 +
                                              auVar43._12_4_ * 0.0 + auVar41._12_4_ * 0.0 +
                                              auVar42._12_4_ * 0.0,
                                              CONCAT48((float)local_2a8._0_4_ * 0.0 +
                                                       auVar43._8_4_ * 0.0 + auVar41._8_4_ * 0.0 +
                                                       auVar42._8_4_ * 0.0,
                                                       CONCAT44((float)local_2a8._0_4_ *
                                                                view::viewMat._52_4_ +
                                                                fVar66 * auVar43._4_4_ +
                                                                fVar72 * auVar41._4_4_ +
                                                                auVar42._4_4_ * fVar5,
                                                                (float)local_2a8._0_4_ *
                                                                view::viewMat._48_4_ +
                                                                fVar54 * auVar43._0_4_ +
                                                                fVar69 * auVar41._0_4_ +
                                                                auVar42._0_4_ * fVar60)))),auVar28,1
                          );
      auVar48 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(fVar68 * 0.0 +
                                              fVar67 * 0.0 + fVar62 * 0.0 + fVar49 * 0.0,
                                              CONCAT48(fVar68 * 0.0 +
                                                       fVar67 * 0.0 + fVar62 * 0.0 + fVar49 * 0.0,
                                                       CONCAT44(fVar68 * view::viewMat._52_4_ +
                                                                fVar67 * fVar5 +
                                                                fVar72 * fVar62 + fVar66 * fVar49,
                                                                fVar68 * view::viewMat._48_4_ +
                                                                fVar67 * fVar60 +
                                                                fVar69 * fVar62 + fVar54 * fVar49)))
                                   ),auVar34,1);
      auVar45 = vpermi2pd_avx512vl(_DAT_0029ef60,auVar48._0_32_,auVar47._0_32_);
      _viewMat = vinsertf64x4_avx512f(auVar46,auVar45,0);
      auVar57 = auVar48._4_12_;
      bVar8 = Engine::transparencyEnabled(engine);
      if (!bVar8) {
        drawStructures();
      }
      view::viewMat_8 = uStack_70;
      _viewMat = local_78;
      DAT_004c06e0 = uStack_68;
      _DAT_004c06e8 = uStack_60;
      DAT_004c06f0 = uStack_58;
      _DAT_004c06f8 = uStack_50;
      DAT_004c0700 = uStack_48;
      DAT_004c0708 = uStack_40;
    }
    iVar10 = (int)uVar18;
    if ((!isRedraw) && (options::groundPlaneMode == 3)) {
      lVar19 = 0;
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[0xb])
                (peVar1,(ulong)(uint)(view::bufferWidth * iVar9),
                 (ulong)(uint)(view::bufferHeight * iVar9));
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar1->_vptr_FrameBuffer[10])
                (peVar1,0,0,(ulong)(uint)(view::bufferWidth * iVar9),
                 (ulong)(uint)(view::bufferHeight * iVar9));
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      aVar7 = DAT_004bcaf8;
      peVar1 = (this->sceneAltFrameBuffer).
               super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      uVar6 = view::bgColor._4_4_;
      (peVar1->clearColor).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)view::bgColor
      ;
      (peVar1->clearColor).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar6;
      (peVar1->clearColor).field_2 = aVar7;
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[4])();
      do {
        plVar2 = *(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar19);
        (**(code **)(*plVar2 + 0x58))
                  (plVar2,(view::bufferWidth * iVar9) / 2,(view::bufferHeight * iVar9) / 2);
        plVar2 = *(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar19);
        (**(code **)(*plVar2 + 0x50))
                  (plVar2,0,0,(view::bufferWidth * iVar9) / 2,(view::bufferHeight * iVar9) / 2);
        (**(code **)(**(long **)((long)&(this->blurFrameBuffers)._M_elems[0].
                                        super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar19) + 0x20))();
        lVar19 = lVar19 + 0x10;
      } while (lVar19 == 0x10);
      (*((this->sceneAltFrameBuffer).
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      local_78 = _viewMat;
      uStack_70 = view::viewMat_8;
      uStack_68 = DAT_004c06e0;
      uStack_60 = _DAT_004c06e8;
      uStack_58 = DAT_004c06f0;
      uStack_50 = _DAT_004c06f8;
      uStack_48 = DAT_004c0700;
      uStack_40 = DAT_004c0708;
      local_348._0_4_ = 1.0;
      local_348._4_4_ = 0.0;
      afStack_340[0] = 0.0;
      afStack_340[1] = 0.0;
      afStack_340[2] = 0.0;
      afStack_340[3] = 1.0;
      afStack_340[4] = 0.0;
      afStack_340[5] = 0.0;
      afStack_340[6] = 0.0;
      afStack_340[7] = 0.0;
      afStack_340[8] = 1.0;
      local_31c = 0;
      afStack_314[0] = 0.0;
      afStack_314[1] = 0.0;
      afStack_314[2] = 1.0;
      iVar9 = (int)local_300;
      uVar13 = (ulong)(uint)(iVar9 << 4);
      puVar14 = (undefined4 *)((long)&local_348 + uVar13);
      if (iVar9 != 0) {
        if (iVar9 == 2) {
          puVar14 = (undefined4 *)((long)afStack_340 + uVar13);
        }
        else {
          puVar14 = (undefined4 *)((long)&local_348 + uVar13 + 4);
        }
      }
      *puVar14 = 0;
      if (iVar9 == 0) {
        pfVar11 = (float *)((long)&local_31c + 4);
      }
      else if (iVar9 == 2) {
        pfVar11 = afStack_314 + 1;
      }
      else {
        pfVar11 = afStack_314;
      }
      *pfVar11 = (float)local_2f8;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = DAT_004c06e0;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = DAT_004c06f0;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = DAT_004c0700;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = DAT_004c0708;
      fVar66 = view::viewMat;
      fVar67 = view::viewMat._4_4_;
      fVar69 = view::viewMat._16_4_;
      fVar72 = view::viewMat._20_4_;
      fVar62 = view::viewMat._32_4_;
      fVar5 = view::viewMat._36_4_;
      fVar60 = view::viewMat._48_4_;
      fVar78 = view::viewMat._52_4_;
      fVar51 = view::viewMat._8_4_;
      fVar54 = view::viewMat._12_4_;
      fVar68 = view::viewMat._24_4_;
      fVar50 = view::viewMat._28_4_;
      fVar49 = view::viewMat._40_4_;
      fVar53 = view::viewMat._44_4_;
      fVar4 = view::viewMat._56_4_;
      fVar55 = view::viewMat._60_4_;
      auVar64._0_4_ =
           afStack_340[1] * fVar4 +
           afStack_340[0] * fVar49 + local_348._4_4_ * fVar68 + fVar51 * (float)local_348;
      auVar64._4_4_ =
           afStack_340[1] * fVar55 +
           afStack_340[0] * fVar53 + local_348._4_4_ * fVar50 + fVar54 * (float)local_348;
      auVar64._8_4_ =
           afStack_340[1] * 0.0 +
           afStack_340[0] * 0.0 + local_348._4_4_ * 0.0 + (float)local_348 * 0.0;
      auVar64._12_4_ =
           afStack_340[1] * 0.0 +
           afStack_340[0] * 0.0 + local_348._4_4_ * 0.0 + (float)local_348 * 0.0;
      auVar75._0_4_ =
           afStack_340[2] * fVar51 + afStack_340[3] * fVar68 + afStack_340[4] * fVar49 +
           afStack_340[5] * fVar4;
      auVar75._4_4_ =
           afStack_340[2] * fVar54 + afStack_340[3] * fVar50 + afStack_340[4] * fVar53 +
           afStack_340[5] * fVar55;
      auVar75._8_4_ =
           afStack_340[2] * 0.0 + afStack_340[3] * 0.0 + afStack_340[4] * 0.0 + afStack_340[5] * 0.0
      ;
      auVar75._12_4_ =
           afStack_340[2] * 0.0 + afStack_340[3] * 0.0 + afStack_340[4] * 0.0 + afStack_340[5] * 0.0
      ;
      auVar79._0_4_ = fVar66 * afStack_340[6];
      auVar79._4_4_ = fVar67 * afStack_340[6];
      auVar79._8_4_ = afStack_340[6] * 0.0;
      auVar79._12_4_ = afStack_340[6] * 0.0;
      auVar80._4_4_ = afStack_340[7];
      auVar80._0_4_ = afStack_340[7];
      auVar80._8_4_ = afStack_340[7];
      auVar80._12_4_ = afStack_340[7];
      auVar82._4_4_ = afStack_340[8];
      auVar82._0_4_ = afStack_340[8];
      auVar82._8_4_ = afStack_340[8];
      auVar82._12_4_ = afStack_340[8];
      auVar43 = vmulps_avx512vl(auVar71,auVar80);
      auVar43 = vaddps_avx512vl(auVar79,auVar43);
      auVar41 = vmulps_avx512vl(auVar65,auVar82);
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)local_31c));
      auVar43 = vaddps_avx512vl(auVar43,auVar41);
      auVar41 = vmulps_avx512vl(auVar63,auVar42);
      auVar43 = vaddps_avx512vl(auVar43,auVar41);
      auVar41 = vmulps_avx512vl(auVar61,auVar42);
      auVar77._0_4_ =
           afStack_340[6] * fVar51 + afStack_340[7] * fVar68 + afStack_340[8] * fVar49 +
           auVar41._0_4_;
      auVar77._4_4_ =
           afStack_340[6] * fVar54 + afStack_340[7] * fVar50 + afStack_340[8] * fVar53 +
           auVar41._4_4_;
      auVar77._8_4_ =
           afStack_340[6] * 0.0 + afStack_340[7] * 0.0 + afStack_340[8] * 0.0 + auVar41._8_4_;
      auVar77._12_4_ =
           afStack_340[6] * 0.0 + afStack_340[7] * 0.0 + afStack_340[8] * 0.0 + auVar41._12_4_;
      auVar52._0_4_ =
           local_31c._4_4_ * fVar51 + afStack_314[0] * fVar68 + afStack_314[1] * fVar49 +
           afStack_314[2] * fVar4;
      auVar52._4_4_ =
           local_31c._4_4_ * fVar54 + afStack_314[0] * fVar50 + afStack_314[1] * fVar53 +
           afStack_314[2] * fVar55;
      auVar52._8_4_ =
           local_31c._4_4_ * 0.0 + afStack_314[0] * 0.0 + afStack_314[1] * 0.0 +
           afStack_314[2] * 0.0;
      auVar52._12_4_ =
           local_31c._4_4_ * 0.0 + afStack_314[0] * 0.0 + afStack_314[1] * 0.0 +
           afStack_314[2] * 0.0;
      auVar46 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(local_31c._4_4_ * 0.0 + afStack_314[0] * 0.0 +
                                              afStack_314[1] * 0.0 + afStack_314[2] * 0.0,
                                              CONCAT48(local_31c._4_4_ * 0.0 + afStack_314[0] * 0.0
                                                       + afStack_314[1] * 0.0 + afStack_314[2] * 0.0
                                                       ,CONCAT44(fVar67 * local_31c._4_4_ +
                                                                 fVar72 * afStack_314[0] +
                                                                 afStack_314[1] * fVar5 +
                                                                 afStack_314[2] * fVar78,
                                                                 fVar66 * local_31c._4_4_ +
                                                                 fVar69 * afStack_314[0] +
                                                                 afStack_314[1] * fVar62 +
                                                                 afStack_314[2] * fVar60)))),auVar52
                           ,1);
      auVar47 = vinsertf32x4_avx512f(ZEXT1664(auVar43),auVar77,1);
      auVar48 = vbroadcasti64x4_avx512f(_DAT_0029ef40);
      auVar46 = vpermi2pd_avx512f(auVar48,auVar47,auVar46);
      auVar47 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(afStack_340[2] * 0.0 + afStack_340[3] * 0.0 +
                                              afStack_340[4] * 0.0 + afStack_340[5] * 0.0,
                                              CONCAT48(afStack_340[2] * 0.0 + afStack_340[3] * 0.0 +
                                                       afStack_340[4] * 0.0 + afStack_340[5] * 0.0,
                                                       CONCAT44(fVar67 * afStack_340[2] +
                                                                fVar72 * afStack_340[3] +
                                                                afStack_340[4] * fVar5 +
                                                                afStack_340[5] * fVar78,
                                                                fVar66 * afStack_340[2] +
                                                                fVar69 * afStack_340[3] +
                                                                afStack_340[4] * fVar62 +
                                                                afStack_340[5] * fVar60)))),auVar75,
                           1);
      auVar48 = vinsertf32x4_avx512f
                          (ZEXT1664(CONCAT412(afStack_340[1] * 0.0 +
                                              afStack_340[0] * 0.0 +
                                              local_348._4_4_ * 0.0 + (float)local_348 * 0.0,
                                              CONCAT48(afStack_340[1] * 0.0 +
                                                       afStack_340[0] * 0.0 +
                                                       local_348._4_4_ * 0.0 +
                                                       (float)local_348 * 0.0,
                                                       CONCAT44(afStack_340[1] * fVar78 +
                                                                afStack_340[0] * fVar5 +
                                                                fVar72 * local_348._4_4_ +
                                                                fVar67 * (float)local_348,
                                                                afStack_340[1] * fVar60 +
                                                                afStack_340[0] * fVar62 +
                                                                fVar69 * local_348._4_4_ +
                                                                fVar66 * (float)local_348)))),
                           auVar64,1);
      auVar45 = vpermi2pd_avx512vl(_DAT_0029ef60,auVar48._0_32_,auVar47._0_32_);
      _viewMat = vinsertf64x4_avx512f(auVar46,auVar45,0);
      auVar46 = ZEXT1664(auVar48._0_16_);
      (*engine->_vptr_Engine[10])(engine,0);
      (*engine->_vptr_Engine[0xb])(engine,7);
      drawStructures();
      (*engine->_vptr_Engine[0xb])(engine,7);
      (*((this->blurFrameBuffers)._M_elems[0].
         super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_FrameBuffer[3])();
      (*((this->copyTexProgram).
         super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ShaderProgram[0x1e])();
      iVar9 = options::shadowBlurIters;
      iVar10 = Engine::getSSAAFactor(engine);
      auVar57 = auVar46._4_12_;
      iVar10 = iVar10 * iVar9;
      if (0 < iVar10) {
        do {
          (*((this->blurFrameBuffers)._M_elems[1].
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_FrameBuffer[3])();
          peVar3 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_238[0] = local_228;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"t_image","");
          (*peVar3->_vptr_ShaderProgram[0x1a])
                    (peVar3,(string *)local_238,
                     (this->blurColorTextures)._M_elems[0].
                     super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          if (local_238[0] != local_228) {
            operator_delete(local_238[0]);
          }
          peVar3 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_258[0] = local_248;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"u_horizontal","");
          (*peVar3->_vptr_ShaderProgram[3])(peVar3,(string *)local_258,1);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0]);
          }
          (*((this->blurProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ShaderProgram[0x1e])();
          (*((this->blurFrameBuffers)._M_elems[0].
             super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_FrameBuffer[3])();
          peVar3 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_278[0] = local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"t_image","");
          (*peVar3->_vptr_ShaderProgram[0x1a])
                    (peVar3,(string *)local_278,
                     (this->blurColorTextures)._M_elems[1].
                     super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          if (local_278[0] != local_268) {
            operator_delete(local_278[0]);
          }
          peVar3 = (this->blurProgram).
                   super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_298[0] = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"u_horizontal","");
          (*peVar3->_vptr_ShaderProgram[3])(peVar3,(string *)local_298,0);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0]);
          }
          (*((this->blurProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ShaderProgram[0x1e])();
          auVar57 = auVar46._4_12_;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      view::viewMat_8 = uStack_70;
      _viewMat = local_78;
      DAT_004c06e0 = uStack_68;
      _DAT_004c06e8 = uStack_60;
      DAT_004c06f0 = uStack_58;
      _DAT_004c06f8 = uStack_50;
      DAT_004c0700 = uStack_48;
      DAT_004c0708 = uStack_40;
      iVar10 = (int)local_300;
    }
    auVar58 = ZEXT1260(auVar57);
    (*engine->_vptr_Engine[6])();
    (*engine->_vptr_Engine[0x24])();
    if (options::transparencyMode != 1) {
      (*engine->_vptr_Engine[0xb])(engine,7);
    }
    view::getCameraViewMatrix();
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1e8 = 0x614d776569765f75;
    local_1e0 = 0x78697274;
    local_1f0 = 0xc;
    local_1dc = 0;
    local_1f8 = &local_1e8;
    (*peVar3->_vptr_ShaderProgram[7])(peVar3,&local_1f8,&local_78);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    view::getCameraPerspectiveMatrix();
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_208 = 0x614d6a6f72705f75;
    local_200 = 0x78697274;
    local_210 = 0xc;
    local_1fc = 0;
    local_218 = &local_208;
    (*peVar3->_vptr_ShaderProgram[7])(peVar3,&local_218,&local_348);
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88 = 0x6569765f75;
    uStack_83 = 0x6f7077;
    uStack_80 = 0x6d69447472;
    local_90 = 0xd;
    local_7b = 0;
    auVar59 = ZEXT856((ulong)local_188._8_8_);
    local_98 = &local_88;
    (*peVar3->_vptr_ShaderProgram[8])(local_188._0_8_,peVar3,&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (options::groundPlaneMode - 1U < 2) {
      peVar3 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_a8 = 0x7265746e65635f75;
      local_b0 = 8;
      local_a0 = 0;
      local_b8 = &local_a8;
      (*peVar3->_vptr_ShaderProgram[9])(state::center,(ulong)DAT_004bdda8,peVar3,&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      peVar3 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_c8 = 0x5873697361625f75;
      local_d0 = 8;
      local_c0 = 0;
      local_d8 = &local_c8;
      (*peVar3->_vptr_ShaderProgram[9])(local_2e8,(ulong)(uint)local_354,peVar3,&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      peVar3 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_e8 = 0x5973697361625f75;
      local_f0 = 8;
      local_e0 = 0;
      auVar59 = (undefined1  [56])0x0;
      auVar58 = (undefined1  [60])0x0;
      local_f8 = &local_e8;
      (*peVar3->_vptr_ShaderProgram[9])(local_2f0,(ulong)(uint)local_358,peVar3,&local_f8);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
    }
    if (options::groundPlaneMode == 3) {
      peVar3 = (this->groundPlaneProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_1c8 = (undefined6 *)0x10;
      local_1a8 = local_198;
      local_1a8 = (undefined6 **)
                  std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_1c8);
      auVar47._8_56_ = extraout_var;
      auVar47._0_8_ = extraout_XMM1_Qa;
      auVar58 = auVar47._4_60_;
      local_198[0] = local_1c8;
      *local_1a8 = (undefined6 *)0x776f646168735f75;
      local_1a8[1] = (undefined6 *)0x7373656e6b726144;
      local_1a0 = local_1c8;
      *(char *)((long)local_1a8 + (long)local_1c8) = '\0';
      auVar59 = (undefined1  [56])0x0;
      (*peVar3->_vptr_ShaderProgram[5])((ulong)options::shadowDarkness,peVar3);
      if (local_1a8 != local_198) {
        operator_delete(local_1a8);
      }
    }
    vVar85 = view::getCameraWorldPosition();
    auVar56._0_4_ = vVar85.field_2;
    auVar56._4_60_ = auVar58;
    auVar48._0_8_ = vVar85._0_8_;
    auVar48._8_56_ = auVar59;
    uVar18 = auVar56._0_8_;
    if ((iVar10 != 2) && (uVar18 = auVar48._0_8_, iVar10 == 1)) {
      auVar43 = vmovshdup_avx(auVar48._0_16_);
      uVar18 = auVar43._0_8_;
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b8 = 0x656d61635f75;
    uStack_1b2 = 0x6172;
    uStack_1b0 = 0x746867696548;
    local_1c0 = 0xe;
    local_1aa = 0;
    local_1c8 = &local_1b8;
    (*peVar3->_vptr_ShaderProgram[5])(uVar18,peVar3,&local_1c8);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8);
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_108 = 0x6e67695370755f75;
    local_110 = 8;
    local_100 = 0;
    local_118 = &local_108;
    (*peVar3->_vptr_ShaderProgram[5])(local_1d8._0_8_,peVar3,&local_118);
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_128 = 0x5a73697361625f75;
    local_130 = 8;
    local_120 = 0;
    local_138 = &local_128;
    (*peVar3->_vptr_ShaderProgram[9])(local_350,(ulong)(uint)local_35c,peVar3,&local_138);
    if (local_138 != &local_128) {
      operator_delete(local_138);
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_148 = 0x756f72675f75;
    uStack_142 = 0x646e;
    uStack_140 = 0x746867696548;
    local_150 = 0xe;
    local_13a = 0;
    local_158 = &local_148;
    (*peVar3->_vptr_ShaderProgram[6])(local_2f8,peVar3,&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    peVar3 = (this->groundPlaneProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_168 = 0x6e656c5f75;
    uStack_163 = 0x687467;
    uStack_160 = 0x656c616353;
    local_170 = 0xd;
    local_15b = 0;
    local_178 = &local_168;
    (*peVar3->_vptr_ShaderProgram[6])(state::lengthScale,peVar3,&local_178);
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    (*((this->groundPlaneProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void GroundPlane::draw(bool isRedraw) {
  if (options::groundPlaneMode == GroundPlaneMode::None) {
    return;
  }

  // don't draw ground in planar mode
  if (view::style == view::NavigateStyle::Planar) return;

  if (!groundPlanePrepared) {
    prepare();
  }
  if (view::upDir != groundPlaneViewCached) {
    populateGroundPlaneGeometry();
  }

  // Get logical "up" direction to which the ground plane is oriented
  int iP;
  float sign;
  std::tie(iP, sign) = getGroundPlaneAxisAndSign();

  glm::vec3 baseUp{0., 0., 0.};
  glm::vec3 baseForward{0., 0., 0.};
  glm::vec3 baseRight{0., 0., 0.};
  baseUp[iP] = 1.;
  baseForward[(iP + 1) % 3] = sign;
  baseRight[(iP + 2) % 3] = sign;

  // Location for ground plane
  double bboxBottom = sign == 1.0 ? std::get<0>(state::boundingBox)[iP] : std::get<1>(state::boundingBox)[iP];
  double bboxHeight = std::get<1>(state::boundingBox)[iP] - std::get<0>(state::boundingBox)[iP];
  double heightEPS = state::lengthScale * 1e-4;
  double groundHeight = bboxBottom - sign * (options::groundPlaneHeightFactor.asAbsolute() + heightEPS);

  // Viewport
  glm::vec4 viewport = render::engine->getCurrentViewport();
  glm::vec2 viewportDim{viewport[2], viewport[3]};
  int factor = render::engine->getSSAAFactor();

  auto setUniforms = [&]() {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    groundPlaneProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));

    glm::mat4 projMat = view::getCameraPerspectiveMatrix();
    groundPlaneProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
    groundPlaneProgram->setUniform("u_viewportDim", viewportDim);

    if (options::groundPlaneMode == GroundPlaneMode::Tile ||
        options::groundPlaneMode == GroundPlaneMode::TileReflection) {
      groundPlaneProgram->setUniform("u_center", state::center);
      groundPlaneProgram->setUniform("u_basisX", baseForward);
      groundPlaneProgram->setUniform("u_basisY", baseRight);
    }

    if (options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {
      groundPlaneProgram->setUniform("u_shadowDarkness", options::shadowDarkness);
    }

    float camHeight = view::getCameraWorldPosition()[iP];
    groundPlaneProgram->setUniform("u_cameraHeight", camHeight);
    groundPlaneProgram->setUniform("u_upSign", sign);
    groundPlaneProgram->setUniform("u_basisZ", baseUp);
    groundPlaneProgram->setUniform("u_groundHeight", groundHeight);
    groundPlaneProgram->setUniform("u_lengthScale", state::lengthScale);
  };

  /*
  // For all effects which will use the alternate scene buffers, prepare them
  if (options::groundPlaneMode == GroundPlaneMode::TileReflection ||
      options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {


    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();
  }
  */

  // Render the scene to implement the mirror effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::TileReflection) {

    // Prepare the alternate scene buffers
    // (use a texture 1/4 the area of the view buffer, it's supposed to be blurry anyway and this saves perf)
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a reflected view matrix
    glm::mat4 origViewMat = view::viewMat;

    glm::vec3 mirrorN = baseUp * sign;
    glm::mat3 mirrorMat3 = glm::mat3(1.0) - 2.0f * glm::outerProduct(mirrorN, mirrorN);
    glm::vec3 tVec{0., 0., 0.};
    tVec[iP] = -groundHeight;
    glm::mat4 mirrorMat =
        glm::translate(glm::mat4(1.0), -tVec) * glm::mat4(mirrorMat3) * glm::translate(glm::mat4(1.0), tVec);
    view::viewMat = view::viewMat * mirrorMat;

    // Draw everything
    if (!render::engine->transparencyEnabled()) { // skip when transparency is turned on
      drawStructures();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  // Render the scene to implement the shadow effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {

    // Prepare the alternate scene buffers
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth, factor * view::bufferHeight);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth, factor * view::bufferHeight);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Make sure all framebuffers are the right shape
    for (int i = 0; i < 2; i++) {
      blurFrameBuffers[i]->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->clear();
    }

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a view matrix which projects on to the ground plane
    glm::mat4 origViewMat = view::viewMat;
    glm::mat4 projMat = glm::mat4(1.0);
    projMat[iP][iP] = 0.;
    projMat[3][iP] = groundHeight;
    view::viewMat = view::viewMat * projMat;

    // Draw everything
    render::engine->setDepthMode();
    render::engine->setBlendMode(BlendMode::Disable);
    drawStructures();

    // Copy the depth buffer to a texture (while upsampling)
    render::engine->setBlendMode(BlendMode::Disable);
    blurFrameBuffers[0]->bindForRendering();
    copyTexProgram->draw();

    // == Blur

    // Do some blur iterations (ends in same buffer it started in)
    int nBlur = options::shadowBlurIters * render::engine->getSSAAFactor();
    // int nBlur = 0;
    for (int i = 0; i < nBlur; i++) {
      // horizontal blur
      blurFrameBuffers[1]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[0].get());
      blurProgram->setUniform("u_horizontal", 1);
      blurProgram->draw();

      // vertical blur
      blurFrameBuffers[0]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[1].get());
      blurProgram->setUniform("u_horizontal", 0);
      blurProgram->draw();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  render::engine->bindSceneBuffer();

  // Render the ground plane
  render::engine->applyTransparencySettings();
  if (options::transparencyMode != TransparencyMode::Simple) {
    render::engine->setBlendMode(BlendMode::Disable);
  }
  setUniforms();
  groundPlaneProgram->draw();
}